

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  ushort uVar1;
  ushort uVar2;
  results *prVar3;
  params *ppVar4;
  raw_node *prVar5;
  bool bVar6;
  potential_solution *ppVar7;
  undefined4 *puVar8;
  uint8 uVar9;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar10;
  int iVar11;
  ulong uVar12;
  undefined4 *puVar13;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar14;
  raw_node *prVar15;
  uint8 *__s;
  uint8 *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint8 uVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  uVar1 = (this->m_best_solution).m_coords.m_low_color;
  uVar2 = (this->m_best_solution).m_coords.m_high_color;
  bVar6 = uVar1 < uVar2;
  if ((this->m_best_solution).m_alpha_block != false) {
    bVar6 = uVar1 >= uVar2 && uVar1 != uVar2;
  }
  prVar3 = this->m_pResults;
  prVar3->m_alternate_rounding = (this->m_best_solution).m_alternate_rounding;
  prVar3->m_enforce_selector = (this->m_best_solution).m_enforce_selector;
  prVar3->m_enforced_selector = (this->m_best_solution).m_enforced_selector;
  prVar3->m_reordered = bVar6;
  if (bVar6 == false) {
    prVar3->m_low_color = (this->m_best_solution).m_coords.m_low_color;
    ppVar7 = (potential_solution *)&(this->m_best_solution).m_coords.m_high_color;
  }
  else {
    ppVar7 = &this->m_best_solution;
    prVar3->m_low_color = (this->m_best_solution).m_coords.m_high_color;
  }
  prVar3->m_high_color = (ppVar7->m_coords).m_low_color;
  puVar13 = &g_invTableColor;
  if (((this->m_best_solution).m_alpha_block & 1U) != 0) {
    puVar13 = &g_invTableAlpha;
  }
  puVar8 = &g_invTableNull;
  if (bVar6 != false) {
    puVar8 = puVar13;
  }
  ppVar4 = this->m_pParams;
  aVar10.m_u32 = 0;
  if (ppVar4->m_pixels_have_alpha == true) {
    aVar10.m_u32 = ppVar4->m_dxt1a_alpha_threshold << 0x18;
  }
  paVar14 = &ppVar4->m_pPixels->field_0;
  __s = prVar3->m_pSelectors;
  if ((this->m_unique_colors).m_size != 1 || ppVar4->m_pixels_have_alpha != false) {
    puVar16 = __s + ppVar4->m_num_pixels;
    uVar9 = '\0';
    uVar19 = 0;
    do {
      uVar21 = '\x03';
      if ((aVar10.m_u32 <= paVar14->m_u32) &&
         (uVar17 = paVar14->m_u32 | 0xff000000, uVar21 = uVar9, uVar17 != uVar19)) {
        if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_0016bc0b:
          uVar20 = (this->m_unique_color_hash_map).m_values.m_size;
        }
        else {
          uVar19 = uVar17 * -0x61c88647 >>
                   ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f);
          uVar12 = (ulong)uVar19;
          prVar5 = (this->m_unique_color_hash_map).m_values.m_p;
          bVar6 = true;
          uVar20 = uVar19;
          if (prVar5[uVar12].m_bits[8] != '\0') {
            prVar15 = prVar5 + uVar12;
            if (*(uint *)prVar15->m_bits == uVar17) {
              bVar6 = false;
            }
            else {
              uVar23 = (ulong)((this->m_unique_color_hash_map).m_values.m_size - 1);
              do {
                iVar11 = (int)uVar12;
                uVar12 = (ulong)(iVar11 - 1);
                if (iVar11 == 0) {
                  uVar12 = uVar23;
                }
                uVar20 = (uint)uVar12;
                prVar15 = prVar15 + -1;
                if (iVar11 == 0) {
                  prVar15 = prVar5 + uVar23;
                }
                if ((uVar20 == uVar19) || (prVar15->m_bits[8] == '\0')) goto LAB_0016bc07;
              } while (*(uint *)prVar15->m_bits != uVar17);
              bVar6 = false;
            }
          }
LAB_0016bc07:
          if (bVar6) goto LAB_0016bc0b;
        }
        uVar21 = *(uint8 *)((long)puVar8 +
                           (ulong)(this->m_best_solution).m_selectors.m_p
                                  [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar20].
                                             m_bits + 4)]);
        uVar9 = uVar21;
        uVar19 = uVar17;
      }
      paVar14 = paVar14 + 1;
      *__s = uVar21;
      __s = __s + 1;
    } while (__s != puVar16);
    goto LAB_0016bcec;
  }
  if ((this->m_unique_color_hash_map).m_num_valid == 0) {
LAB_0016bcc3:
    uVar19 = (this->m_unique_color_hash_map).m_values.m_size;
  }
  else {
    uVar18 = paVar14->m_u32 | 0xff000000;
    uVar17 = uVar18 * -0x61c88647 >> ((byte)(this->m_unique_color_hash_map).m_hash_shift & 0x1f);
    prVar5 = (this->m_unique_color_hash_map).m_values.m_p;
    bVar6 = true;
    uVar19 = uVar17;
    if (prVar5[uVar17].m_bits[8] != '\0') {
      prVar15 = prVar5 + uVar17;
      if (*(uint *)prVar15->m_bits == uVar18) {
        bVar6 = false;
      }
      else {
        uVar22 = (this->m_unique_color_hash_map).m_values.m_size - 1;
        do {
          bVar24 = uVar19 == 0;
          prVar15 = prVar15 + -1;
          uVar19 = uVar19 - 1;
          if (bVar24) {
            prVar15 = prVar5 + uVar22;
            uVar19 = uVar22;
          }
          if ((uVar19 == uVar17) || (prVar15->m_bits[8] == '\0')) goto LAB_0016bcbf;
        } while (*(uint *)prVar15->m_bits != uVar18);
        bVar6 = false;
      }
    }
LAB_0016bcbf:
    if (bVar6) goto LAB_0016bcc3;
  }
  memset(__s,(uint)*(byte *)((long)puVar8 +
                            (ulong)(this->m_best_solution).m_selectors.m_p
                                   [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar19].
                                              m_bits + 4)]),(ulong)ppVar4->m_num_pixels);
LAB_0016bcec:
  prVar3 = this->m_pResults;
  prVar3->m_alpha_block = (this->m_best_solution).m_alpha_block;
  prVar3->m_error = (this->m_best_solution).m_error;
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution()
    {
        compute_selectors();
        bool invert_selectors;

        if (m_best_solution.m_alpha_block)
        {
            invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
        }
        else
        {
            CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

            invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
        }

        m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
        m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
        m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
        m_pResults->m_reordered = invert_selectors;
        if (invert_selectors)
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
        }
        else
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
        }

        const uint8* pInvert_table = g_invTableNull;
        if (invert_selectors)
        {
            pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;
        }

        const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

        const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
        uint8* pDst_selectors = m_pResults->m_pSelectors;

        if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha))
        {
            uint32 c = utils::read_le32(pSrc_pixels);

            CRNLIB_ASSERT(c >= alpha_thresh);

            c |= 0xFF000000U;

            unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
            CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

            uint unique_color_index = it->second;

            uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

            memset(pDst_selectors, selector, m_pParams->m_num_pixels);
        }
        else
        {
            uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

            uint8 prev_selector = 0;
            uint32 prev_color = 0;

            do
            {
                uint32 c = utils::read_le32(pSrc_pixels);
                pSrc_pixels++;

                uint8 selector = 3;

                if (c >= alpha_thresh)
                {
                    c |= 0xFF000000U;

                    if (c == prev_color)
                    {
                        selector = prev_selector;
                    }
                    else
                    {
                        unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

                        CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

                        uint unique_color_index = it->second;

                        selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

                        prev_color = c;
                        prev_selector = selector;
                    }
                }

                *pDst_selectors++ = selector;
            } while (pDst_selectors != pDst_selectors_end);
        }

        m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
        m_pResults->m_error = m_best_solution.m_error;
    }